

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O1

void __thiscall ValueHashTable<Sym_*,_Value_*>::Clear(ValueHashTable<Sym_*,_Value_*> *this,uint key)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  DictionaryStats *this_01;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *buffer;
  NodeBase *pNVar2;
  bool bVar3;
  Type *pTVar4;
  bool bVar5;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  local_58 = (undefined1  [8])(this->table + (ulong)key % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  bVar5 = true;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_58;
  iter.last = (NodeBase *)this;
  do {
    bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_58);
    if (!bVar3) {
      return;
    }
    pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_58);
    pNVar2 = iter.last;
    buffer = iter.super_Iterator.list;
    uVar1 = pTVar4->value->m_id;
    if (key < uVar1) {
      bVar5 = false;
    }
    else if (uVar1 == key) {
      this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                (iter.last)->next;
      SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
      UnlinkCurrentNode((EditingIterator *)local_58);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (this_00,buffer,0x18);
      this_01 = (DictionaryStats *)pNVar2[3].next;
      if (this_01 != (DictionaryStats *)0x0) {
        if (bVar5) {
          bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                  EditingIterator::Next((EditingIterator *)local_58);
          bVar3 = !bVar3;
        }
        else {
          bVar3 = false;
        }
        DictionaryStats::Remove(this_01,bVar3);
      }
    }
  } while (key < uVar1);
  return;
}

Assistant:

void Clear(uint key)
    {
        uint hash = this->Hash(key);
        SListBase<HashBucket> * list = &this->table[hash];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, list, iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }